

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void event_debug_assert_is_setup_(event *ev)

{
  event_debug_entry *peVar1;
  uint u;
  
  if (event_debug_mode_on_ != 0) {
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
    }
    if (global_debug_map.hth_table == (event_debug_entry **)0x0) {
LAB_0022ceb7:
      event_errx(-0x21522153,
                 "%s called on a non-initialized event %p (events: 0x%x, fd: %d, flags: 0x%x)",
                 "event_debug_assert_is_setup_",ev,(ulong)(uint)(int)ev->ev_events,
                 (ulong)(uint)ev->ev_fd,(int)(ev->ev_evcallback).evcb_flags);
    }
    peVar1 = (event_debug_entry *)
             (global_debug_map.hth_table +
             ((ulong)ev >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length);
    do {
      peVar1 = (peVar1->node).hte_next;
      if (peVar1 == (event_debug_entry *)0x0) goto LAB_0022ceb7;
    } while (peVar1->ptr != ev);
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
      return;
    }
  }
  return;
}

Assistant:

static void event_debug_assert_is_setup_(const struct event *ev)
{
	struct event_debug_entry *dent, find;

	if (!event_debug_mode_on_)
		return;

	find.ptr = ev;
	EVLOCK_LOCK(event_debug_map_lock_, 0);
	dent = HT_FIND(event_debug_map, &global_debug_map, &find);
	if (!dent) {
		event_errx(EVENT_ERR_ABORT_,
		    "%s called on a non-initialized event %p"
		    " (events: 0x%x, fd: "EV_SOCK_FMT
		    ", flags: 0x%x)",
		    __func__, ev, ev->ev_events,
		    EV_SOCK_ARG(ev->ev_fd), ev->ev_flags);
	}
	EVLOCK_UNLOCK(event_debug_map_lock_, 0);
}